

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O2

void Acec_TreeMarkTFI_rec(Gia_Man_t *p,int Id,Vec_Bit_t *vMarked)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  
  while( true ) {
    pGVar3 = Gia_ManObj(p,Id);
    iVar1 = Vec_BitEntry(vMarked,Id);
    if (iVar1 != 0) {
      return;
    }
    Vec_BitWriteEntry(vMarked,Id,1);
    uVar2 = (uint)*(undefined8 *)pGVar3;
    if ((int)uVar2 < 0) break;
    if ((uVar2 & 0x1fffffff) == 0x1fffffff) {
      return;
    }
    Acec_TreeMarkTFI_rec(p,Id - (uVar2 & 0x1fffffff),vMarked);
    Id = Id - (*(uint *)&pGVar3->field_0x4 & 0x1fffffff);
  }
  return;
}

Assistant:

void Acec_TreeMarkTFI_rec( Gia_Man_t * p, int Id, Vec_Bit_t * vMarked )
{
    Gia_Obj_t * pObj = Gia_ManObj(p, Id);
    if ( Vec_BitEntry(vMarked, Id) )
        return;
    Vec_BitWriteEntry( vMarked, Id, 1 );
    if ( !Gia_ObjIsAnd(pObj) )
        return;
    Acec_TreeMarkTFI_rec( p, Gia_ObjFaninId0(pObj, Id), vMarked );
    Acec_TreeMarkTFI_rec( p, Gia_ObjFaninId1(pObj, Id), vMarked );
}